

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::next(Session *this,string *msg,UtcTimeStamp *timeStamp,bool queued)

{
  bool bVar1;
  BeginString *beginString;
  DataDictionary *applicationDataDictionary;
  MessageParseError *anon_var_0;
  InvalidMessage *e;
  Message local_200;
  ApplVerID local_a8;
  DataDictionary *local_48;
  DataDictionary *applicationDD;
  DataDictionary *sessionDD;
  byte local_21;
  UtcTimeStamp *pUStack_20;
  bool queued_local;
  UtcTimeStamp *timeStamp_local;
  string *msg_local;
  Session *this_local;
  
  local_21 = queued;
  pUStack_20 = timeStamp;
  timeStamp_local = (UtcTimeStamp *)msg;
  msg_local = (string *)this;
  SessionState::onIncoming(&this->m_state,msg);
  beginString = SessionID::getBeginString(&this->m_sessionID);
  applicationDD =
       DataDictionaryProvider::getSessionDataDictionary(&this->m_dataDictionaryProvider,beginString)
  ;
  bVar1 = SessionID::isFIXT(&this->m_sessionID);
  if (bVar1) {
    ApplVerID::ApplVerID(&local_a8,&this->m_senderDefaultApplVerID);
    applicationDataDictionary =
         DataDictionaryProvider::getApplicationDataDictionary
                   (&this->m_dataDictionaryProvider,&local_a8);
    ApplVerID::~ApplVerID(&local_a8);
    local_48 = applicationDataDictionary;
    Message::Message(&local_200,(string *)timeStamp_local,applicationDD,applicationDataDictionary,
                     (bool)(this->m_validateLengthAndChecksum & 1));
    next(this,&local_200,pUStack_20,(bool)(local_21 & 1));
    Message::~Message(&local_200);
  }
  else {
    Message::Message((Message *)&e,(string *)timeStamp_local,applicationDD,
                     (bool)(this->m_validateLengthAndChecksum & 1));
    next(this,(Message *)&e,pUStack_20,(bool)(local_21 & 1));
    Message::~Message((Message *)&e);
  }
  return;
}

Assistant:

void Session::next( const std::string& msg, const UtcTimeStamp& timeStamp, bool queued )
{
  try
  {
    m_state.onIncoming( msg );
    const DataDictionary& sessionDD = 
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if( m_sessionID.isFIXT() )
    {
      const DataDictionary& applicationDD =
        m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      next( Message( msg, sessionDD, applicationDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
    else
    {
      next( Message( msg, sessionDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
  }
  catch( InvalidMessage& e )
  {
    m_state.onEvent( e.what() );

    try
    {
      if( identifyType(msg) == MsgType_Logon )
      {
        m_state.onEvent( "Logon message is not valid" );
        disconnect();
      }
    } catch( MessageParseError& ) {}
    throw e;
  }
}